

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.cc
# Opt level: O1

Optional<webrtc::CartesianPoint<float>_>
webrtc::GetNormalIfPlanar
          (vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
           *array_geometry)

{
  bool bVar1;
  string *result;
  ulong uVar2;
  long lVar3;
  pointer pCVar4;
  ulong uVar5;
  ulong uVar6;
  float *pfVar7;
  undefined8 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  Optional<webrtc::CartesianPoint<float>_> OVar18;
  uint local_18c;
  FatalMessage local_188;
  
  local_188._0_8_ =
       ((long)(array_geometry->
              super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(array_geometry->
              super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  local_18c = 1;
  if ((ulong)local_188._0_8_ < 2) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                       ((unsigned_long *)&local_188,&local_18c,"array_geometry.size() > 1u");
  }
  else {
    result = (string *)0x0;
  }
  if (result != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/array_util.cc"
               ,0x4c,result);
    rtc::FatalMessage::~FatalMessage(&local_188);
  }
  pCVar4 = (array_geometry->
           super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  fVar10 = pCVar4[1].c[0] - pCVar4->c[0];
  fVar11 = pCVar4[1].c[1] - pCVar4->c[1];
  fVar9 = pCVar4[1].c[2] - pCVar4->c[2];
  uVar2 = ((long)(array_geometry->
                 super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 2) *
          -0x5555555555555555;
  uVar8 = 0;
  if (uVar2 < 3) {
    bVar1 = true;
    uVar5 = 2;
    fVar13 = 0.0;
    fVar12 = 0.0;
    fVar14 = 0.0;
  }
  else {
    pfVar7 = pCVar4[2].c + 2;
    bVar1 = true;
    uVar5 = 2;
    do {
      fVar12 = ((CartesianPoint<float> *)(pfVar7 + -2))->c[0] - pfVar7[-5];
      fVar14 = pfVar7[-1] - pfVar7[-4];
      fVar13 = *pfVar7 - pfVar7[-3];
      fVar15 = fVar11 * fVar13 + fVar14 * -fVar9;
      fVar16 = fVar9 * fVar12 + fVar13 * -fVar10;
      fVar17 = fVar10 * fVar14 + fVar12 * -fVar11;
      if (1e-06 <= fVar17 * fVar17 + fVar15 * fVar15 + fVar16 * fVar16) {
        bVar1 = false;
      }
      uVar5 = uVar5 + 1;
    } while ((uVar5 < uVar2) && (pfVar7 = pfVar7 + 3, bVar1));
  }
  if (bVar1) {
LAB_001745c8:
    uVar6 = 0;
    fVar9 = 0.0;
  }
  else {
    uVar6 = 0x100000000;
    fVar15 = fVar11 * fVar13 - fVar14 * fVar9;
    fVar13 = fVar9 * fVar12 - fVar13 * fVar10;
    fVar9 = fVar14 * fVar10 - fVar12 * fVar11;
    lVar3 = uVar2 - uVar5;
    if (uVar5 <= uVar2 && lVar3 != 0) {
      pCVar4 = pCVar4 + uVar5;
      do {
        if (1e-06 <= ABS((pCVar4->c[2] - pCVar4[-1].c[2]) * fVar9 +
                         (pCVar4->c[0] - pCVar4[-1].c[0]) * fVar15 +
                         (pCVar4->c[1] - pCVar4[-1].c[1]) * fVar13)) goto LAB_001745c8;
        pCVar4 = pCVar4 + 1;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    uVar8 = CONCAT44(fVar13,fVar15);
  }
  OVar18._8_8_ = (uint)fVar9 | uVar6;
  OVar18.value_.c[0] = (float)(int)uVar8;
  OVar18.value_.c[1] = (float)(int)((ulong)uVar8 >> 0x20);
  return OVar18;
}

Assistant:

rtc::Optional<Point> GetNormalIfPlanar(
    const std::vector<Point>& array_geometry) {
  RTC_DCHECK_GT(array_geometry.size(), 1u);
  const Point first_pair_direction =
      PairDirection(array_geometry[0], array_geometry[1]);
  Point pair_direction(0.f, 0.f, 0.f);
  size_t i = 2u;
  bool is_linear = true;
  for (; i < array_geometry.size() && is_linear; ++i) {
    pair_direction = PairDirection(array_geometry[i - 1], array_geometry[i]);
    if (!AreParallel(first_pair_direction, pair_direction)) {
      is_linear = false;
    }
  }
  if (is_linear) {
    return rtc::Optional<Point>();
  }
  const Point normal_direction =
      CrossProduct(first_pair_direction, pair_direction);
  for (; i < array_geometry.size(); ++i) {
    pair_direction = PairDirection(array_geometry[i - 1], array_geometry[i]);
    if (!ArePerpendicular(normal_direction, pair_direction)) {
      return rtc::Optional<Point>();
    }
  }
  return rtc::Optional<Point>(normal_direction);
}